

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_2_5::jacobiSVD<double>
               (Matrix33<double> *A,Matrix33<double> *U,Vec3<double> *S,Matrix33<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  int j;
  bool bVar1;
  int i;
  long lVar2;
  double *pdVar3;
  long lVar4;
  int i_1;
  int iVar5;
  uint uVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double r;
  undefined1 local_f8 [40];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  double local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  Matrix33<double> local_98;
  double local_50;
  double local_48;
  double dStack_40;
  
  pdVar3 = (double *)&local_98;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar3 = *(double *)A;
    A = (Matrix33<double> *)((long)A + 8);
    pdVar3 = pdVar3 + 1;
  }
  U->x[1][0] = 0.0;
  U->x[1][1] = 0.0;
  U->x[1][2] = 0.0;
  U->x[2][0] = 0.0;
  U->x[0][1] = 0.0;
  U->x[0][2] = 0.0;
  U->x[2][1] = 0.0;
  U->x[0][0] = 1.0;
  U->x[1][1] = 1.0;
  U->x[2][2] = 1.0;
  V->x[1][0] = 0.0;
  V->x[1][1] = 0.0;
  V->x[1][2] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[0][0] = 1.0;
  V->x[1][1] = 1.0;
  V->x[2][2] = 1.0;
  local_50 = anon_unknown_18::maxOffDiag<double>(&local_98);
  local_50 = local_50 * tol;
  if ((local_50 != 0.0) || (NAN(local_50))) {
    uVar8 = SUB84(local_98.x[1][0],0);
    uVar9 = (undefined4)((ulong)local_98.x[1][0] >> 0x20);
    local_b8._8_8_ = 0;
    local_b8._0_8_ = local_98.x[2][2];
    uStack_a0 = SUB84(local_98.x[0][0],0);
    uStack_9c = (undefined4)((ulong)local_98.x[0][0] >> 0x20);
    dVar17 = local_98.x[2][1];
    dVar18 = local_98.x[1][2];
    dVar11 = local_98.x[0][1];
    local_c8 = local_98.x[0][2];
    dStack_c0 = local_98.x[2][0];
    uVar6 = 0;
    dVar21 = local_98.x[1][1];
    do {
      dVar20 = (double)CONCAT44(uStack_9c,uStack_a0);
      dVar13 = dVar11 - (double)CONCAT44(uVar9,uVar8);
      dVar10 = ABS(dVar13);
      dVar15 = ABS(dVar20 + dVar21) * tol;
      if (dVar10 <= dVar15) {
        dVar16 = dVar21 - dVar20;
        dVar19 = dVar11 + (double)CONCAT44(uVar9,uVar8);
        dVar14 = 0.0;
        dVar13 = 1.0;
      }
      else {
        dVar13 = (dVar20 + dVar21) / dVar13;
        dVar14 = 1.0 / SQRT(dVar13 * dVar13 + 1.0);
        dVar14 = (double)((ulong)-dVar14 & -(ulong)(dVar13 < 0.0) |
                         ~-(ulong)(dVar13 < 0.0) & (ulong)dVar14);
        dVar13 = dVar13 * dVar14;
        dVar16 = (dVar11 + (double)CONCAT44(uVar9,uVar8)) * dVar14 + (dVar21 - dVar20) * dVar13;
        dVar19 = dVar13 * dVar11 - dVar14 * dVar21;
        dVar19 = dVar19 + dVar19;
      }
      if (ABS(dVar19) <= ABS(dVar16) * tol) {
        if (dVar15 < dVar10) {
          dVar15 = 0.0;
          dVar10 = 1.0;
          goto LAB_0010990f;
        }
        local_98.x[1][0] = 0.0;
        local_98.x[0][1] = 0.0;
        bVar7 = false;
      }
      else {
        dVar16 = dVar16 / dVar19;
        dVar20 = 1.0 / (SQRT(dVar16 * dVar16 + 1.0) + ABS(dVar16));
        dVar15 = (double)((ulong)-dVar20 & -(ulong)(dVar16 < 0.0) |
                         ~-(ulong)(dVar16 < 0.0) & (ulong)dVar20);
        dVar10 = 1.0 / SQRT(dVar15 * dVar15 + 1.0);
        dVar15 = dVar15 * dVar10;
LAB_0010990f:
        local_98.x[1][0] = 0.0;
        dVar20 = -dVar21;
        local_98.x[0][1] = 0.0;
        dVar16 = dVar13 * dVar15 + dVar14 * dVar10;
        dVar14 = dVar13 * dVar10 + -dVar15 * dVar14;
        dVar21 = dVar16 * ((double)CONCAT44(uStack_9c,uStack_a0) * dVar15 + dVar10 * dVar11) +
                 dVar14 * ((double)CONCAT44(uVar9,uVar8) * dVar15 + dVar21 * dVar10);
        dVar20 = ((double)CONCAT44(uStack_9c,uStack_a0) * dVar10 + -dVar11 * dVar15) * dVar14 +
                 -dVar16 * ((double)CONCAT44(uVar9,uVar8) * dVar10 + dVar20 * dVar15);
        dVar11 = dVar17 * dVar15;
        dVar13 = dVar18 * dVar16;
        dVar17 = dVar15 * dStack_c0 + dVar10 * dVar17;
        dVar18 = dVar16 * local_c8 + dVar14 * dVar18;
        local_98.x[0][0] = dVar20;
        local_98.x[1][1] = dVar21;
        (anonymous_namespace)::jacobiRotateRight<double,0,1>(U,dVar14,dVar16);
        (anonymous_namespace)::jacobiRotateRight<double,0,1>(V,dVar10,dVar15);
        bVar7 = true;
        dStack_c0 = dVar10 * dStack_c0 - dVar11;
        local_c8 = dVar14 * local_c8 - dVar13;
      }
      dVar11 = ABS(local_c8 - dStack_c0);
      dVar10 = ABS(dVar20 + (double)local_b8._0_8_) * tol;
      if (dVar11 <= dVar10) {
        dVar14 = (double)local_b8._0_8_ - dVar20;
        dVar16 = local_c8 + dStack_c0;
        dVar15 = 0.0;
        dVar13 = 1.0;
      }
      else {
        dVar13 = (dVar20 + (double)local_b8._0_8_) / (local_c8 - dStack_c0);
        dVar15 = 1.0 / SQRT(dVar13 * dVar13 + 1.0);
        dVar15 = (double)((ulong)-dVar15 & -(ulong)(dVar13 < 0.0) |
                         ~-(ulong)(dVar13 < 0.0) & (ulong)dVar15);
        dVar13 = dVar13 * dVar15;
        dVar14 = (local_c8 + dStack_c0) * dVar15 + ((double)local_b8._0_8_ - dVar20) * dVar13;
        dVar16 = dVar13 * local_c8 - dVar15 * (double)local_b8._0_8_;
        dVar16 = dVar16 + dVar16;
      }
      if (ABS(dVar16) <= ABS(dVar14) * tol) {
        if (dVar10 < dVar11) {
          dVar10 = 0.0;
          dVar11 = 1.0;
          goto LAB_00109c37;
        }
        local_98.x[2][0] = 0.0;
        local_98.x[0][2] = 0.0;
        local_f8._0_16_ = ZEXT816(0);
        bVar1 = false;
      }
      else {
        dVar14 = dVar14 / dVar16;
        dVar11 = 1.0 / (SQRT(dVar14 * dVar14 + 1.0) + ABS(dVar14));
        dVar10 = (double)((ulong)-dVar11 & -(ulong)(dVar14 < 0.0) |
                         ~-(ulong)(dVar14 < 0.0) & (ulong)dVar11);
        dVar11 = 1.0 / SQRT(dVar10 * dVar10 + 1.0);
        dVar10 = dVar10 * dVar11;
LAB_00109c37:
        dVar16 = -(double)local_b8._0_8_;
        local_98.x[2][0] = 0.0;
        local_98.x[0][2] = 0.0;
        dVar14 = dVar13 * dVar10 + dVar15 * dVar11;
        dVar13 = dVar13 * dVar11 + -dVar10 * dVar15;
        local_b8._0_8_ =
             dVar14 * (dVar20 * dVar10 + dVar11 * local_c8) +
             dVar13 * (dStack_c0 * dVar10 + (double)local_b8._0_8_ * dVar11);
        dVar20 = (dVar20 * dVar11 + -local_c8 * dVar10) * dVar13 +
                 -dVar14 * (dStack_c0 * dVar11 + dVar16 * dVar10);
        local_98.x[0][1] = dVar13 * 0.0 - dVar17 * dVar14;
        local_98.x[1][0] = dVar11 * 0.0 - dVar18 * dVar10;
        local_f8._8_8_ = local_98.x[1][0];
        local_f8._0_8_ = local_98.x[0][1];
        dVar17 = dVar14 * 0.0 + dVar13 * dVar17;
        dVar18 = dVar10 * 0.0 + dVar11 * dVar18;
        local_98.x[0][0] = dVar20;
        local_98.x[2][2] = (double)local_b8._0_8_;
        (anonymous_namespace)::jacobiRotateRight<double,0,2>(U,dVar13,dVar14);
        (anonymous_namespace)::jacobiRotateRight<double,0,2>(V,dVar11,dVar10);
        bVar1 = true;
      }
      dVar11 = ABS(dVar18 - dVar17);
      dVar10 = ABS((double)local_b8._0_8_ + dVar21) * tol;
      if (dVar11 <= dVar10) {
        dVar16 = (double)local_b8._0_8_ - dVar21;
        dVar14 = dVar18 + dVar17;
        dVar15 = 0.0;
        dVar13 = 1.0;
      }
      else {
        dVar13 = ((double)local_b8._0_8_ + dVar21) / (dVar18 - dVar17);
        dVar15 = 1.0 / SQRT(dVar13 * dVar13 + 1.0);
        dVar15 = (double)((ulong)-dVar15 & -(ulong)(dVar13 < 0.0) |
                         ~-(ulong)(dVar13 < 0.0) & (ulong)dVar15);
        dVar13 = dVar13 * dVar15;
        dVar16 = (dVar17 + dVar18) * dVar15 + ((double)local_b8._0_8_ - dVar21) * dVar13;
        dVar14 = dVar13 * dVar18 - dVar15 * (double)local_b8._0_8_;
        dVar14 = dVar14 + dVar14;
      }
      if (ABS(dVar14) <= ABS(dVar16) * tol) {
        dVar16 = 1.0;
        dVar14 = 0.0;
        if (dVar10 < dVar11) goto LAB_00109f7a;
        local_98.x[2][1] = 0.0;
        local_98.x[1][2] = 0.0;
        if (!bVar7 && !bVar1) {
          auVar12._8_8_ = local_b8._0_8_;
          auVar12._0_8_ = dVar21;
          break;
        }
        local_c8 = 0.0;
        dStack_c0 = 0.0;
      }
      else {
        dVar16 = dVar16 / dVar14;
        dVar11 = 1.0 / (SQRT(dVar16 * dVar16 + 1.0) + ABS(dVar16));
        dVar14 = (double)((ulong)-dVar11 & -(ulong)(dVar16 < 0.0) |
                         ~-(ulong)(dVar16 < 0.0) & (ulong)dVar11);
        dVar16 = 1.0 / SQRT(dVar14 * dVar14 + 1.0);
        dVar14 = dVar14 * dVar16;
LAB_00109f7a:
        dVar19 = dVar13 * dVar14 + dVar15 * dVar16;
        dVar10 = dVar21 * dVar14;
        dVar11 = dVar13 * dVar16 + -dVar14 * dVar15;
        dVar21 = (dVar21 * dVar16 + -dVar18 * dVar14) * dVar11 +
                 -dVar19 * (dVar17 * dVar16 + -(double)local_b8._0_8_ * dVar14);
        local_b8._0_8_ =
             dVar19 * (dVar10 + dVar16 * dVar18) +
             dVar11 * (dVar17 * dVar14 + (double)local_b8._0_8_ * dVar16);
        local_98.x[2][1] = 0.0;
        local_98.x[1][2] = 0.0;
        local_98.x[0][1] = dVar16 * (double)local_f8._0_8_ + dVar14 * -0.0;
        local_98.x[1][0] = dVar11 * (double)local_f8._8_8_ + dVar19 * -0.0;
        local_c8 = dVar14 * (double)local_f8._0_8_ + dVar16 * 0.0;
        dStack_c0 = dVar19 * (double)local_f8._8_8_ + dVar11 * 0.0;
        local_98.x[0][2] = local_c8;
        local_98.x[1][1] = dVar21;
        local_98.x[2][0] = dStack_c0;
        local_98.x[2][2] = (double)local_b8._0_8_;
        local_48 = local_98.x[0][1];
        dStack_40 = local_98.x[1][0];
        (anonymous_namespace)::jacobiRotateRight<double,1,2>(U,dVar11,dVar19);
        (anonymous_namespace)::jacobiRotateRight<double,1,2>(V,dVar16,dVar14);
        local_f8._8_8_ = dStack_40;
        local_f8._0_8_ = local_48;
      }
      uStack_cc = (undefined4)((ulong)local_b8._0_8_ >> 0x20);
      uStack_d0 = (undefined4)local_b8._0_8_;
      dVar17 = anon_unknown_18::maxOffDiag<double>(&local_98);
      dVar11 = local_f8._0_8_;
      auVar12._8_4_ = uStack_d0;
      auVar12._0_8_ = dVar21;
      auVar12._12_4_ = uStack_cc;
      if (dVar17 <= local_50) break;
      local_b8._8_4_ = uStack_d0;
      local_b8._0_8_ = auVar12._8_8_;
      local_b8._12_4_ = uStack_cc;
      uVar8 = local_f8._8_4_;
      uVar9 = local_f8._12_4_;
      uStack_a0 = SUB84(dVar20,0);
      uStack_9c = (undefined4)((ulong)dVar20 >> 0x20);
      dVar17 = 0.0;
      dVar18 = 0.0;
      bVar7 = uVar6 < 0x13;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  else {
    auVar12._8_8_ = local_98.x[2][2];
    auVar12._0_8_ = local_98.x[1][1];
    dVar20 = local_98.x[0][0];
  }
  S->x = dVar20;
  S->y = (double)auVar12._0_8_;
  S->z = (double)auVar12._8_8_;
  pdVar3 = (double *)U;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    if ((&S->x)[lVar2] < 0.0) {
      (&S->x)[lVar2] = -(&S->x)[lVar2];
      for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 0x18) {
        *(ulong *)((long)pdVar3 + lVar4) = *(ulong *)((long)pdVar3 + lVar4) ^ 0x8000000000000000;
      }
    }
    pdVar3 = pdVar3 + 1;
  }
  lVar2 = 2;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      dVar21 = (&S->x)[lVar4];
      if (dVar21 < (&S->y)[lVar4]) {
        j = (int)lVar4;
        (&S->x)[lVar4] = (&S->y)[lVar4];
        (&S->y)[lVar4] = dVar21;
        anon_unknown_18::swapColumns<double>(U,j,j + 1);
        anon_unknown_18::swapColumns<double>(V,j,j + 1);
      }
    }
    lVar2 = lVar2 + -1;
  }
  if (forcePositiveDeterminant) {
    dVar21 = Matrix33<double>::determinant(U);
    if (dVar21 < 0.0) {
      for (lVar2 = 0x10; lVar2 != 0x58; lVar2 = lVar2 + 0x18) {
        *(ulong *)((long)U->x[0] + lVar2) = *(ulong *)((long)U->x[0] + lVar2) ^ 0x8000000000000000;
      }
      S->z = -S->z;
    }
    dVar21 = Matrix33<double>::determinant(V);
    if (dVar21 < 0.0) {
      for (lVar2 = 0x10; lVar2 != 0x58; lVar2 = lVar2 + 0x18) {
        *(ulong *)((long)V->x[0] + lVar2) = *(ulong *)((long)V->x[0] + lVar2) ^ 0x8000000000000000;
      }
      S->z = -S->z;
    }
  }
  return;
}

Assistant:

void
jacobiSVD (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
           IMATH_INTERNAL_NAMESPACE::Matrix33<T>& U,
           IMATH_INTERNAL_NAMESPACE::Vec3<T>& S,
           IMATH_INTERNAL_NAMESPACE::Matrix33<T>& V,
           const T tol,
           const bool forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}